

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyFEND.hpp
# Opt level: O1

void njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<27>,_njoy::ENDFtk::section::Type<27>_>::
     verifyFEND(StructureDivision *structureDivision,long lineNumber)

{
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  char *args;
  
  bVar2 = StructureDivision::isSendPermissive(structureDivision);
  if (((bVar2) && ((structureDivision->tail).fields._M_elems[1] == 0)) &&
     (0 < (structureDivision->tail).fields._M_elems[0])) {
    return;
  }
  bVar2 = StructureDivision::isSendPermissive(structureDivision);
  iVar1 = (structureDivision->tail).fields._M_elems[1];
  if (((bVar2) && (iVar1 != 0)) && (0 < (structureDivision->tail).fields._M_elems[0])) {
    args = "Encountered duplicate SEND record in File {}";
  }
  else {
    if ((((structureDivision->tail).fields._M_elems[2] != 0) && (iVar1 != 0)) &&
       ((structureDivision->tail).fields._M_elems[0] != 0)) {
      tools::Log::error<char_const*,int>("Inappropriate section encountered in File {}",0x1b);
      tools::Log::info<char_const*,int>
                ("Section number: {}",(structureDivision->tail).fields._M_elems[2]);
      goto LAB_001706b2;
    }
    bVar2 = StructureDivision::isSendPermissive(structureDivision);
    if (((bVar2) && ((structureDivision->tail).fields._M_elems[1] == 0)) &&
       ((structureDivision->tail).fields._M_elems[0] == 0)) {
      args = "Encountered MEND record before FEND record in File {}";
    }
    else {
      bVar2 = StructureDivision::isSendPermissive(structureDivision);
      if (!bVar2) {
        return;
      }
      if ((structureDivision->tail).fields._M_elems[1] != 0) {
        return;
      }
      if ((structureDivision->tail).fields._M_elems[0] != -1) {
        return;
      }
      args = "Encountered TEND record before FEND record in File {}";
    }
  }
  tools::Log::error<char_const*,int>(args,0x1b);
LAB_001706b2:
  tools::Log::info<char_const*,long>("Line number: {}",lineNumber);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyFEND( const StructureDivision& structureDivision,
            long lineNumber ) {

  if ( not structureDivision.isFend() ) {

    int MF = Base::MF();
    if ( structureDivision.isSend() ) {

      Log::error( "Encountered duplicate SEND record in File {}", MF );
      Log::info("Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isHead() ) {

      Log::error( "Inappropriate section encountered in File {}", MF );
      Log::info( "Section number: {}", asHead( structureDivision ).section() );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isMend() ) {

      Log::error( "Encountered MEND record before FEND record in File {}", MF );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isTend() ) {

      Log::error( "Encountered TEND record before FEND record in File {}", MF );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
  }
}